

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# salsa20.cpp
# Opt level: O0

void __thiscall salsa20::print_key_array(salsa20 *this)

{
  const_iterator pvVar1;
  ostream *poVar2;
  value_type_conflict *v;
  const_iterator __end1;
  const_iterator __begin1;
  array<unsigned_int,_16UL> *__range1;
  salsa20 *this_local;
  
  __end1 = std::array<unsigned_int,_16UL>::begin(&this->m_array);
  pvVar1 = std::array<unsigned_int,_16UL>::end(&this->m_array);
  for (; __end1 != pvVar1; __end1 = __end1 + 1) {
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,*__end1);
    std::operator<<(poVar2," ");
  }
  std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void salsa20::print_key_array() const
{
    for (const auto &v : m_array)
        std::cout << v << " ";
    std::cout << std::endl;
}